

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

void duckdb::RegularLikeFunction<duckdb::LikeOperator,false>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t count;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  bool bVar4;
  BoundFunctionExpression *pBVar5;
  LikeMatcher *this;
  reference pvVar6;
  reference right;
  idx_t iVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t i;
  idx_t iVar11;
  idx_t i_1;
  ulong uVar12;
  data_ptr_t pdVar13;
  ulong uVar14;
  ulong uVar15;
  anon_union_16_2_67f50693_for_value local_88;
  anon_union_16_2_67f50693_for_value local_78;
  long local_68;
  
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar5->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl == (FunctionData *)0x0) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    right = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
    BinaryExecutor::ExecuteStandard<duckdb::string_t,duckdb::string_t,bool,duckdb::LikeOperator>
              (pvVar6,right,result,input->count);
    return;
  }
  this = (LikeMatcher *)
         unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
         operator->(&pBVar5->bind_info);
  pvVar6 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  count = input->count;
  if (pvVar6->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    pdVar13 = pvVar6->data;
    FlatVector::VerifyFlatVector(pvVar6);
    FlatVector::VerifyFlatVector(result);
    if ((pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar13 = pdVar13 + 8;
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        local_78._0_8_ = *(undefined8 *)(pdVar13 + -8);
        local_78.pointer.ptr = (char *)*(undefined8 *)pdVar13;
        bVar4 = LikeMatcher::Match(this,(string_t *)&local_78.pointer);
        pdVar1[iVar11] = bVar4;
        pdVar13 = pdVar13 + 0x10;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &(pvVar6->validity).super_TemplatedValidityMask<unsigned_long>);
      uVar12 = 0;
      for (uVar15 = 0; uVar15 != count + 0x3f >> 6; uVar15 = uVar15 + 1) {
        puVar2 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
LAB_018461af:
          pdVar8 = pdVar13 + uVar12 * 0x10 + 8;
          for (; uVar10 = uVar12, uVar12 < uVar9; uVar12 = uVar12 + 1) {
            local_78._0_8_ = *(undefined8 *)(pdVar8 + -8);
            local_78.pointer.ptr = (char *)*(undefined8 *)pdVar8;
            bVar4 = LikeMatcher::Match(this,(string_t *)&local_78.pointer);
            pdVar1[uVar12] = bVar4;
            pdVar8 = pdVar8 + 0x10;
          }
        }
        else {
          uVar3 = puVar2[uVar15];
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_018461af;
          uVar10 = uVar9;
          if (uVar3 != 0) {
            pdVar8 = pdVar13 + uVar12 * 0x10 + 8;
            uVar14 = 0;
            for (; uVar10 = uVar12, uVar12 < uVar9; uVar12 = uVar12 + 1) {
              if ((uVar3 >> (uVar14 & 0x3f) & 1) != 0) {
                local_78._0_8_ = *(undefined8 *)(pdVar8 + -8);
                local_78.pointer.ptr = (char *)*(undefined8 *)pdVar8;
                bVar4 = LikeMatcher::Match(this,(string_t *)&local_78.pointer);
                pdVar1[uVar12] = bVar4;
              }
              pdVar8 = pdVar8 + 0x10;
              uVar14 = uVar14 + 1;
            }
          }
        }
        uVar12 = uVar10;
      }
    }
  }
  else if (pvVar6->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    pdVar13 = pvVar6->data;
    puVar2 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_78._0_8_ = *(undefined8 *)pdVar13;
    local_78.pointer.ptr = (char *)*(undefined8 *)(pdVar13 + 8);
    bVar4 = LikeMatcher::Match(this,(string_t *)&local_78.pointer);
    *pdVar1 = bVar4;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78.pointer);
    Vector::ToUnifiedFormat(pvVar6,count,(UnifiedVectorFormat *)&local_78.pointer);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        iVar7 = iVar11;
        if (*(long *)local_78._0_8_ != 0) {
          iVar7 = (idx_t)*(uint *)(*(long *)local_78._0_8_ + iVar11 * 4);
        }
        local_88._0_8_ = *(undefined8 *)(local_78.pointer.ptr + iVar7 * 0x10);
        local_88.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + iVar7 * 0x10 + 8);
        bVar4 = LikeMatcher::Match(this,(string_t *)&local_88.pointer);
        pdVar1[iVar11] = bVar4;
      }
    }
    else {
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        iVar7 = iVar11;
        if (*(long *)local_78._0_8_ != 0) {
          iVar7 = (idx_t)*(uint *)(*(long *)local_78._0_8_ + iVar11 * 4);
        }
        if ((*(ulong *)(local_68 + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
        }
        else {
          local_88._0_8_ = *(undefined8 *)(local_78.pointer.ptr + iVar7 * 0x10);
          local_88.pointer.ptr = (char *)*(undefined8 *)(local_78.pointer.ptr + iVar7 * 0x10 + 8);
          bVar4 = LikeMatcher::Match(this,(string_t *)&local_88.pointer);
          pdVar1[iVar11] = bVar4;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78.pointer);
  }
  return;
}

Assistant:

static void RegularLikeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (func_expr.bind_info) {
		auto &matcher = func_expr.bind_info->Cast<LikeMatcher>();
		// use fast like matcher
		UnaryExecutor::Execute<string_t, bool>(input.data[0], result, input.size(), [&](string_t input) {
			return INVERT ? !matcher.Match(input) : matcher.Match(input);
		});
	} else {
		// use generic like matcher
		BinaryExecutor::ExecuteStandard<string_t, string_t, bool, OP>(input.data[0], input.data[1], result,
		                                                              input.size());
	}
}